

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

pair<unsigned_int,_Elf64_Sym> * __thiscall
pstack::Elf::GnuHash::findSymbol
          (pair<unsigned_int,_Elf64_Sym> *__return_storage_ptr__,GnuHash *this,char *name)

{
  uint32_t uVar1;
  element_type *peVar2;
  Sym *pSVar3;
  bool local_129;
  int local_fc;
  pair<int,_Elf64_Sym> local_f8;
  byte local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  uint local_9c;
  undefined1 local_98 [4];
  uint chainhash;
  value_type sym;
  pair<int,_Elf64_Sym> local_78;
  uint local_58 [2];
  uint idx;
  ulong local_30;
  Off mask;
  unsigned_long bloomword;
  char *pcStack_18;
  uint32_t symhash;
  char *name_local;
  GnuHash *this_local;
  
  pcStack_18 = name;
  name_local = (char *)this;
  bloomword._4_4_ = anon_unknown_20::gnu_hash(name);
  peVar2 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  uVar1 = bloomoff(this,(ulong)(bloomword._4_4_ >> 6) % (ulong)(this->header).bloom_size);
  mask = Reader::readObj<unsigned_long>(peVar2,(ulong)uVar1);
  local_30 = 1L << ((byte)bloomword._4_4_ & 0x3f) |
             1L << ((byte)(bloomword._4_4_ >> ((byte)(this->header).bloom_shift & 0x1f)) & 0x3f);
  if ((mask & local_30) == local_30) {
    peVar2 = std::
             __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    uVar1 = bucketoff(this,(ulong)bloomword._4_4_ % (ulong)(this->header).nbuckets);
    local_58[0] = Reader::readObj<unsigned_int>(peVar2,(ulong)uVar1);
    if (local_58[0] < (this->header).symoffset) {
      sym.st_size._4_4_ = 0;
      pSVar3 = undef();
      std::make_pair<int,Elf64_Sym_const&>(&local_78,(int *)((long)&sym.st_size + 4),pSVar3);
      std::pair<unsigned_int,_Elf64_Sym>::pair<int,_Elf64_Sym,_true>
                (__return_storage_ptr__,&local_78);
    }
    else {
      while( true ) {
        peVar2 = std::
                 __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->syms);
        Reader::readObj<Elf64_Sym>((value_type *)local_98,peVar2,(ulong)local_58[0] * 0x18);
        peVar2 = std::
                 __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        uVar1 = chainoff(this,(ulong)(local_58[0] - (this->header).symoffset));
        local_9c = Reader::readObj<unsigned_int>(peVar2,(ulong)uVar1);
        local_c1 = 0;
        local_129 = false;
        if ((local_9c | 1) == (bloomword._4_4_ | 1)) {
          peVar2 = std::
                   __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->strings);
          (*peVar2->_vptr_Reader[7])(&local_c0,peVar2,(ulong)(uint)local_98);
          local_c1 = 1;
          local_129 = std::operator==(&local_c0,pcStack_18);
        }
        if ((local_c1 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_c0);
        }
        if (local_129 != false) {
          std::make_pair<unsigned_int&,Elf64_Sym&>
                    (__return_storage_ptr__,local_58,(value_type *)local_98);
          return __return_storage_ptr__;
        }
        if ((local_9c & 1) != 0) break;
        local_58[0] = local_58[0] + 1;
      }
      local_fc = 0;
      pSVar3 = undef();
      std::make_pair<int,Elf64_Sym_const&>(&local_f8,&local_fc,pSVar3);
      std::pair<unsigned_int,_Elf64_Sym>::pair<int,_Elf64_Sym,_true>
                (__return_storage_ptr__,&local_f8);
    }
  }
  else {
    local_58[1] = 0;
    pSVar3 = undef();
    std::make_pair<int,Elf64_Sym_const&>((pair<int,_Elf64_Sym> *)&idx,(int *)(local_58 + 1),pSVar3);
    std::pair<unsigned_int,_Elf64_Sym>::pair<int,_Elf64_Sym,_true>
              (__return_storage_ptr__,(pair<int,_Elf64_Sym> *)&idx);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<uint32_t, Sym>
GnuHash::findSymbol(const char *name) const {
    auto symhash = gnu_hash(name);

    auto bloomword = hash->readObj<Elf::Off>(bloomoff((symhash/ELF_BITS) % header.bloom_size));

    Elf::Off mask = Elf::Off(1) << symhash % ELF_BITS |
                    Elf::Off(1) << (symhash >> header.bloom_shift) % ELF_BITS;

    if ((bloomword & mask) != mask) {
       return std::make_pair(0, undef());
    }

    auto idx = hash->readObj<uint32_t>(bucketoff(symhash % header.nbuckets));
    if (idx < header.symoffset) {
        return std::make_pair(0, undef());
    }
    for (;;) {
        auto sym = syms->readObj<Sym>(idx * sizeof (Sym));
        auto chainhash = hash->readObj<uint32_t>(chainoff(idx - header.symoffset));
        if ((chainhash | 1U)  == (symhash | 1U) && strings->readString(sym.st_name) == name)
              return std::make_pair(idx, sym);
        if ((chainhash & 1U) != 0) {
           return std::make_pair(0, undef());
        }
        ++idx;
    }
}